

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

double __thiscall soplex::SPxSolverBase<double>::value(SPxSolverBase<double> *this)

{
  bool bVar1;
  Representation RVar2;
  Type TVar3;
  SPxSense SVar4;
  double *pdVar5;
  UpdateVector<double> *vec;
  SPxSolverBase<double> *in_RDI;
  VectorBase<double> *this_00;
  double dVar6;
  double dVar7;
  double x;
  SPxSolverBase<double> *in_stack_00000088;
  VectorBase<double> *in_stack_ffffffffffffffb8;
  VectorBase<double> *in_stack_ffffffffffffffc0;
  undefined8 local_18;
  undefined8 local_8;
  
  bVar1 = isInitialized(in_RDI);
  if (bVar1) {
    RVar2 = rep(in_RDI);
    if (RVar2 == ROW) {
      TVar3 = type(in_RDI);
      if (TVar3 == LEAVE) {
        SVar4 = SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
        coPvec(in_RDI);
        fRhs(in_RDI);
        local_18 = VectorBase<double>::operator*
                             (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        local_18 = (double)SVar4 * local_18;
      }
      else {
        SVar4 = SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
        this_00 = (VectorBase<double> *)nonbasicValue(in_stack_00000088);
        vec = coPvec(in_RDI);
        fRhs(in_RDI);
        dVar6 = VectorBase<double>::operator*(this_00,&vec->super_VectorBase<double>);
        local_18 = (double)SVar4 * ((double)this_00 + dVar6);
      }
    }
    else {
      SVar4 = SPxLPBase<double>::spxSense(&in_RDI->super_SPxLPBase<double>);
      dVar6 = nonbasicValue(in_stack_00000088);
      fVec(in_RDI);
      coPrhs(in_RDI);
      dVar7 = VectorBase<double>::operator*(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_18 = (double)SVar4 * (dVar6 + dVar7);
    }
    pdVar5 = SPxLPBase<double>::objOffset(&in_RDI->super_SPxLPBase<double>);
    local_8 = local_18 + *pdVar5;
  }
  else {
    pdVar5 = (double *)infinity();
    local_8 = *pdVar5;
  }
  return local_8;
}

Assistant:

R SPxSolverBase<R>::value()
   {
      assert(isInitialized());

      R x;

      // calling value() without having a suitable status is an error.
      if(!isInitialized())
         return R(infinity);

      if(rep() == ROW)
      {
         if(type() == LEAVE)
            x = int(SPxLPBase<R>::spxSense()) * (coPvec() *
                                                 fRhs()); // the contribution of maxRowObj() is missing
         else
            x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + (coPvec() * fRhs()));
      }
      else
         x = int(SPxLPBase<R>::spxSense()) * (nonbasicValue() + fVec() * coPrhs());

      return x + this->objOffset();
   }